

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::BaseTag(BaseTag *this,string *params_file)

{
  ifstream fin;
  
  *(code **)this = std::__cxx11::ostringstream::~ostringstream;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined ***)this = &PTR__BaseTag_00121440;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseTag_00121570;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseTag_00121678;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseTag_001216b0;
  *(undefined ***)&this->super_MMAPInferencer = &PTR__BaseTag_001216d8;
  despot::Floor::Floor(&this->floor_);
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  current_ = this;
  std::ifstream::ifstream(&fin,(params_file->_M_dataplus)._M_p,_S_in);
  Init(this,(istream *)&fin);
  std::ifstream::~ifstream(&fin);
  return;
}

Assistant:

BaseTag::BaseTag(string params_file) :
  robot_pos_unknown_(false) {
	current_ = this;
	ifstream fin(params_file.c_str(), ifstream::in);
	Init(fin);
}